

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_andi_8_pd7(void)

{
  uint uVar1;
  uint address;
  uint uVar2;
  uint res;
  uint ea;
  uint src;
  
  uVar1 = m68ki_read_imm_8();
  address = m68ki_cpu.dar[0xf] - 2;
  m68ki_cpu.dar[0xf] = address;
  uVar2 = m68ki_read_8_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_cpu.n_flag = uVar1 & uVar2;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.n_flag);
  return;
}

Assistant:

static void m68k_op_andi_8_pd7(void)
{
	uint src = OPER_I_8();
	uint ea = EA_A7_PD_8();
	uint res = src & m68ki_read_8(ea);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;

	m68ki_write_8(ea, res);
}